

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O3

void __thiscall
FIX::HttpConnection::processResetSession
          (HttpConnection *this,HttpMessage *request,stringstream *h,stringstream *b)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  Parameters *this_00;
  _Rb_tree_header *p_Var3;
  _func_int **pp_Var4;
  pointer pcVar5;
  undefined *puVar6;
  int iVar7;
  string *psVar8;
  const_iterator cVar9;
  Session *this_01;
  A *pAVar10;
  long *plVar11;
  size_t sVar12;
  SessionNotFound *this_02;
  _func_int **pp_Var13;
  ostream *poVar14;
  bool bVar15;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar16;
  string sessionQualifier;
  string targetCompID;
  string senderCompID;
  string beginString;
  string sessionUrl;
  CENTER center;
  HttpMessage copy;
  A a;
  H2 h2;
  SessionID sessionID;
  string local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  stringstream *local_7e0;
  HttpMessage *local_7d8;
  long *local_7d0;
  long local_7c8;
  long local_7c0 [2];
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  undefined1 local_710 [432];
  ostream *local_560;
  HttpMessage local_558;
  undefined1 local_508 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_4f0 [26];
  undefined1 local_350 [432];
  ostream *local_1a0;
  SessionID local_198;
  
  local_7e0 = b;
  HttpMessage::HttpMessage(&local_558,request);
  pcVar2 = local_710 + 0x10;
  local_710._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"BeginString","");
  psVar8 = HttpMessage::getParameter(request,(string *)local_710);
  local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
  pcVar5 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_750,pcVar5,pcVar5 + psVar8->_M_string_length);
  if ((char *)local_710._0_8_ != pcVar2) {
    operator_delete((void *)local_710._0_8_,local_710._16_8_ + 1);
  }
  local_710._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"SenderCompID","");
  psVar8 = HttpMessage::getParameter(request,(string *)local_710);
  local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
  pcVar5 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_770,pcVar5,pcVar5 + psVar8->_M_string_length);
  if ((char *)local_710._0_8_ != pcVar2) {
    operator_delete((void *)local_710._0_8_,local_710._16_8_ + 1);
  }
  local_710._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"TargetCompID","");
  psVar8 = HttpMessage::getParameter(request,(string *)local_710);
  local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
  pcVar5 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_790,pcVar5,pcVar5 + psVar8->_M_string_length);
  if ((char *)local_710._0_8_ != pcVar2) {
    operator_delete((void *)local_710._0_8_,local_710._16_8_ + 1);
  }
  local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
  local_7b0._M_string_length = 0;
  local_7b0.field_2._M_local_buf[0] = '\0';
  local_710._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"SessionQualifier","");
  this_00 = &local_558.m_parameters;
  local_7d8 = request;
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_710);
  p_Var3 = &local_558.m_parameters._M_t._M_impl.super__Rb_tree_header;
  if ((char *)local_710._0_8_ != pcVar2) {
    operator_delete((void *)local_710._0_8_,local_710._16_8_ + 1);
  }
  if ((_Rb_tree_header *)cVar9._M_node != p_Var3) {
    local_710._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"SessionQualifier","");
    HttpMessage::getParameter(&local_558,(string *)local_710);
    std::__cxx11::string::_M_assign((string *)&local_7b0);
    if ((char *)local_710._0_8_ != pcVar2) {
      operator_delete((void *)local_710._0_8_,local_710._16_8_ + 1);
    }
  }
  SessionID::SessionID(&local_198,&local_750,&local_770,&local_790,&local_7b0);
  this_01 = Session::lookupSession(&local_198);
  if (this_01 != (Session *)0x0) {
    HttpMessage::getParameterString_abi_cxx11_((string *)local_710,local_7d8);
    std::operator+(&local_730,"/session",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_710);
    if ((char *)local_710._0_8_ != pcVar2) {
      operator_delete((void *)local_710._0_8_,local_710._16_8_ + 1);
    }
    local_710._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"confirm","");
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,(key_type *)local_710);
    if ((_Rb_tree_header *)cVar9._M_node == p_Var3) {
      bVar15 = false;
    }
    else {
      local_350._0_8_ = local_350 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"confirm","");
      psVar8 = HttpMessage::getParameter(&local_558,(string *)local_350);
      iVar7 = std::__cxx11::string::compare((char *)psVar8);
      bVar15 = iVar7 != 0;
      if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
        operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
      }
    }
    if ((char *)local_710._0_8_ != pcVar2) {
      operator_delete((void *)local_710._0_8_,local_710._16_8_ + 1);
    }
    if (bVar15) {
      Session::reset(this_01);
      local_710._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"confirm","");
      pVar16 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::equal_range(&this_00->_M_t,(key_type *)local_710);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar16.first._M_node,(_Base_ptr)pVar16.second._M_node
                    );
      if ((char *)local_710._0_8_ != pcVar2) {
        operator_delete((void *)local_710._0_8_,local_710._16_8_ + 1);
      }
      poVar14 = (ostream *)(h + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,"<META http-equiv=\'refresh\' content=2;URL=\'",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"/session",8);
      HttpMessage::getParameterString_abi_cxx11_((string *)local_710,&local_558);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,(char *)local_710._0_8_,local_710._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\'>",2);
      if ((char *)local_710._0_8_ != pcVar2) {
        operator_delete((void *)local_710._0_8_,local_710._16_8_ + 1);
      }
      poVar14 = (ostream *)(local_7e0 + 0x10);
      HTML::CENTER::CENTER((CENTER *)local_710,poVar14);
      std::__ostream_insert<char,std::char_traits<char>>(local_560,">",1);
      HTML::H2::H2((H2 *)local_350,poVar14);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0,">",1);
      HTML::A::A((A *)local_508,poVar14);
      HttpMessage::getParameterString_abi_cxx11_(&local_820,&local_558);
      std::operator+(&local_800,"/session",&local_820);
      pAVar10 = HTML::A::href((A *)local_508,&local_800);
      local_7d0 = local_7c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7d0,local_198.m_frozenString._M_dataplus._M_p,
                 local_198.m_frozenString._M_dataplus._M_p +
                 local_198.m_frozenString._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(pAVar10->super_TAG).field_0x38,(char *)local_7d0,local_7c8);
      std::__ostream_insert<char,std::char_traits<char>>((pAVar10->super_TAG).m_stream,">",1);
      if (local_7d0 != local_7c0) {
        operator_delete(local_7d0,local_7c0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_800._M_dataplus._M_p != &local_800.field_2) {
        operator_delete(local_800._M_dataplus._M_p,local_800.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_820._M_dataplus._M_p != &local_820.field_2) {
        operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
      }
      HTML::TAG::~TAG((TAG *)local_508);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," has been reset",0xf);
      HTML::TAG::~TAG((TAG *)local_350);
    }
    else {
      poVar14 = (ostream *)(local_7e0 + 0x10);
      HTML::CENTER::CENTER((CENTER *)local_710,poVar14);
      std::__ostream_insert<char,std::char_traits<char>>(local_560,">",1);
      HTML::H2::H2((H2 *)local_350,poVar14);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0,">",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,"Are you sure you want to reset session ",0x27);
      HTML::A::A((A *)local_508,poVar14);
      HttpMessage::getParameterString_abi_cxx11_(&local_820,local_7d8);
      std::operator+(&local_800,&local_730,&local_820);
      pAVar10 = HTML::A::href((A *)local_508,&local_800);
      local_7d0 = local_7c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7d0,local_198.m_frozenString._M_dataplus._M_p,
                 local_198.m_frozenString._M_dataplus._M_p +
                 local_198.m_frozenString._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(pAVar10->super_TAG).field_0x38,(char *)local_7d0,local_7c8);
      std::__ostream_insert<char,std::char_traits<char>>((pAVar10->super_TAG).m_stream,">",1);
      if (local_7d0 != local_7c0) {
        operator_delete(local_7d0,local_7c0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_800._M_dataplus._M_p != &local_800.field_2) {
        operator_delete(local_800._M_dataplus._M_p,local_800.field_2._M_allocated_capacity + 1);
      }
      paVar1 = &local_820.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_820._M_dataplus._M_p != paVar1) {
        operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
      }
      HTML::TAG::~TAG((TAG *)local_508);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"?",1);
      HTML::TAG::~TAG((TAG *)local_350);
      HTML::TAG::~TAG((TAG *)local_710);
      HTML::CENTER::CENTER((CENTER *)local_710,poVar14);
      std::__ostream_insert<char,std::char_traits<char>>(local_560,">",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"[",1);
      HTML::A::A((A *)local_350,poVar14);
      HttpMessage::toString_abi_cxx11_(&local_800,local_7d8);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_800);
      pp_Var4 = (_func_int **)(local_508 + 0x10);
      pp_Var13 = (_func_int **)(plVar11 + 2);
      if ((_func_int **)*plVar11 == pp_Var13) {
        local_508._16_8_ = *pp_Var13;
        aaStack_4f0[0]._0_8_ = plVar11[3];
        local_508._0_8_ = pp_Var4;
      }
      else {
        local_508._16_8_ = *pp_Var13;
        local_508._0_8_ = (_func_int **)*plVar11;
      }
      local_508._8_8_ = plVar11[1];
      *plVar11 = (long)pp_Var13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      pAVar10 = HTML::A::href((A *)local_350,(string *)local_508);
      local_820._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_820,"YES, reset session","");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(pAVar10->super_TAG).field_0x38,local_820._M_dataplus._M_p,
                 local_820._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((pAVar10->super_TAG).m_stream,">",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_820._M_dataplus._M_p != paVar1) {
        operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
      }
      if ((_func_int **)local_508._0_8_ != pp_Var4) {
        operator_delete((void *)local_508._0_8_,(ulong)(local_508._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_800._M_dataplus._M_p != &local_800.field_2) {
        operator_delete(local_800._M_dataplus._M_p,local_800.field_2._M_allocated_capacity + 1);
      }
      HTML::TAG::~TAG((TAG *)local_350);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"]",1);
      puVar6 = HTML::NBSP;
      if (HTML::NBSP == (undefined *)0x0) {
        std::ios::clear((int)poVar14 + (int)*(undefined8 *)(*(long *)poVar14 + -0x18));
      }
      else {
        sVar12 = strlen(HTML::NBSP);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,puVar6,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"[",1);
      HTML::A::A((A *)local_350,poVar14);
      pAVar10 = HTML::A::href((A *)local_350,&local_730);
      local_508._0_8_ = pp_Var4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_508,"NO, do not reset session","");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(pAVar10->super_TAG).field_0x38,(char *)local_508._0_8_,local_508._8_8_
                );
      std::__ostream_insert<char,std::char_traits<char>>((pAVar10->super_TAG).m_stream,">",1);
      if ((_func_int **)local_508._0_8_ != pp_Var4) {
        operator_delete((void *)local_508._0_8_,(ulong)(local_508._16_8_ + 1));
      }
      HTML::TAG::~TAG((TAG *)local_350);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"]",1);
    }
    HTML::TAG::~TAG((TAG *)local_710);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_730._M_dataplus._M_p != &local_730.field_2) {
      operator_delete(local_730._M_dataplus._M_p,local_730.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198.m_frozenString._M_dataplus._M_p != &local_198.m_frozenString.field_2) {
      operator_delete(local_198.m_frozenString._M_dataplus._M_p,
                      local_198.m_frozenString.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198.m_sessionQualifier._M_dataplus._M_p != &local_198.m_sessionQualifier.field_2) {
      operator_delete(local_198.m_sessionQualifier._M_dataplus._M_p,
                      local_198.m_sessionQualifier.field_2._M_allocated_capacity + 1);
    }
    FieldBase::~FieldBase((FieldBase *)&local_198.m_targetCompID);
    FieldBase::~FieldBase((FieldBase *)&local_198.m_senderCompID);
    FieldBase::~FieldBase((FieldBase *)&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
      operator_delete(local_7b0._M_dataplus._M_p,
                      CONCAT71(local_7b0.field_2._M_allocated_capacity._1_7_,
                               local_7b0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_790._M_dataplus._M_p != &local_790.field_2) {
      operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_770._M_dataplus._M_p != &local_770.field_2) {
      operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_750._M_dataplus._M_p != &local_750.field_2) {
      operator_delete(local_750._M_dataplus._M_p,local_750.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&this_00->_M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558.m_root._M_dataplus._M_p != &local_558.m_root.field_2) {
      operator_delete(local_558.m_root._M_dataplus._M_p,
                      local_558.m_root.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  this_02 = (SessionNotFound *)__cxa_allocate_exception(0x50);
  local_710._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"");
  SessionNotFound::SessionNotFound(this_02,(string *)local_710);
  __cxa_throw(this_02,&SessionNotFound::typeinfo,FIX::Exception::~Exception);
}

Assistant:

void HttpConnection::processResetSession
( const HttpMessage& request, std::stringstream& h, std::stringstream& b )
{
  try
  {
    HttpMessage copy = request;
    std::string beginString = request.getParameter( "BeginString" );
    std::string senderCompID = request.getParameter( "SenderCompID" );
    std::string targetCompID = request.getParameter( "TargetCompID" );
    std::string sessionQualifier;
    if( copy.hasParameter("SessionQualifier") )
      sessionQualifier = copy.getParameter( "SessionQualifier" );

    SessionID sessionID( beginString, senderCompID, targetCompID, sessionQualifier );
    Session* pSession = Session::lookupSession( sessionID );
    if( pSession == 0 ) throw SessionNotFound();

    std::string sessionUrl = "/session" + request.getParameterString();

    bool confirm = false;
    if( copy.hasParameter("confirm") && copy.getParameter("confirm") != "0" )
    {
      confirm = true;
      pSession->reset();
      copy.removeParameter("confirm");
    }

    if( confirm )
    {
      h << "<META http-equiv='refresh' content=2;URL='" << "/session" << copy.getParameterString() << "'>";
      CENTER center(b); center.text();
      H2 h2(b); h2.text();
      { A a(b); a.href("/session" + copy.getParameterString()).text(sessionID.toString()); }
      b << " has been reset";
    }
    else
    {
      { CENTER center(b); center.text();
        H2 h2(b); h2.text();
        b << "Are you sure you want to reset session ";
        { A a(b); a.href(sessionUrl + request.getParameterString()).text(sessionID.toString()); }
        b << "?";
      }
      { CENTER center(b); center.text();
        b << "[";
        { A a(b); a.href(request.toString() + "&confirm=1").text("YES, reset session"); }
        b << "]" << NBSP << "[";
        { A a(b); a.href(sessionUrl).text("NO, do not reset session"); }
        b << "]";
      }
    }
  }
  catch( std::exception& e )
  {
    b << e.what();
  }
}